

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O3

wstring_view __thiscall mjs::rtrim(mjs *this,wstring_view s,version ver)

{
  bool bVar1;
  mjs *pmVar2;
  mjs *pmVar3;
  wstring_view wVar4;
  
  pmVar2 = this + 1;
  do {
    pmVar3 = (mjs *)0x0;
    if (pmVar2 == (mjs *)0x1) break;
    bVar1 = is_whitespace_or_line_terminator
                      ((char16_t)((wchar_t *)s._M_len)[(long)(pmVar2 + -2)],(version)s._M_str);
    pmVar3 = pmVar2 + -1;
    pmVar2 = pmVar3;
  } while (bVar1);
  wVar4._M_str = (wchar_t *)s._M_len;
  wVar4._M_len = (size_t)pmVar3;
  return wVar4;
}

Assistant:

std::wstring_view rtrim(std::wstring_view s, version ver) {
    size_t end_pos = s.length();
    while (end_pos && is_whitespace_or_line_terminator(s[end_pos-1], ver)) {
        --end_pos;
    }
    return s.substr(0, end_pos);
}